

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O3

t_int * tabreceive_perform(t_int *w)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  void *__s;
  long lVar7;
  long lVar8;
  
  __s = (void *)w[2];
  lVar2 = *(long *)(w[1] + 0x30);
  uVar4 = (uint)w[3];
  if (lVar2 == 0) {
    if (uVar4 == 0) goto LAB_00118d61;
  }
  else {
    iVar1 = *(int *)(w[1] + 0x40);
    lVar6 = (long)iVar1;
    if ((long)(int)uVar4 < (long)iVar1) {
      lVar6 = (long)(int)uVar4;
    }
    if (lVar6 != 0) {
      lVar7 = 0;
      lVar8 = 0;
      do {
        *(undefined4 *)((long)__s + lVar8 * 4) = *(undefined4 *)(lVar2 + lVar8 * 8);
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + -4;
      } while (lVar6 != lVar8);
      __s = (void *)((long)__s - lVar7);
    }
    uVar5 = uVar4 - iVar1;
    bVar3 = (int)uVar4 < iVar1;
    uVar4 = uVar5;
    if (uVar5 == 0 || bVar3) goto LAB_00118d61;
  }
  memset(__s,0,(ulong)uVar4 << 2);
LAB_00118d61:
  return w + 4;
}

Assistant:

static t_int *tabreceive_perform(t_int *w)
{
    t_tabreceive *x = (t_tabreceive *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    int n = (int)w[3];
    t_word *from = x->x_vec;
    if (from)
    {
        t_int vecsize = x->x_npoints;
        if (vecsize > n)
            vecsize = n;
        while (vecsize--)
            *out++ = (from++)->w_float;
        vecsize = n - x->x_npoints;
        if (vecsize > 0)
            while (vecsize--)
                *out++ = 0;
    }
    else while (n--) *out++ = 0;
    return (w+4);
}